

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr.hpp
# Opt level: O2

shared_ptr<MyClass> * __thiscall
estl::shared_ptr<MyClass>::operator=(shared_ptr<MyClass> *this,shared_ptr<MyClass> *o)

{
  control_block *pcVar1;
  
  if (this->ptr_ != o->ptr_) {
    decrease_counters(this);
    pcVar1 = o->control_block_ptr_;
    this->ptr_ = o->ptr_;
    this->control_block_ptr_ = pcVar1;
    increase_counters(this);
  }
  return this;
}

Assistant:

shared_ptr<T>& operator=(const shared_ptr<T>& o)
    {
        if (ptr_ == o.ptr_) return *this;
        decrease_counters();
        ptr_ = o.ptr_;
        control_block_ptr_ = o.control_block_ptr_;
        increase_counters();
        return *this;
    }